

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O2

void __thiscall SDT::Unary::Unary(Unary *this)

{
  allocator local_23;
  allocator local_22;
  allocator local_21;
  
  (this->super_SDTNode).sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_SDTNode).sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_SDTNode).sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_SDTNode)._vptr_SDTNode = (_func_int **)&PTR_dfs_00120970;
  std::__cxx11::string::string((string *)&this->code,"",&local_21);
  std::__cxx11::string::string((string *)&this->addr,"",&local_22);
  std::__cxx11::string::string((string *)&this->op,"",&local_23);
  this->gotoTrue = 0;
  this->gotoFalse = 0;
  return;
}

Assistant:

virtual void dfs(TreeNode &treeNode,SDTNode *fa) {
            if (treeNode.sons.empty()) {
                return;
            }
            if(treeNode.opt<=1){
                Unary *unary_1 = new Unary;
                sons.push_back(unary_1);
                unary_1->dfs(SON(1));
                addr = newtemp();
                if(treeNode.opt==0) gen("not",unary_1->addr,"_",addr);
                else gen("neg",unary_1->addr,"_",addr);
            }else if(treeNode.opt==2){
                Factor *factor_1 = new Factor;
                sons.push_back(factor_1);
                factor_1->dfs(SON(0));
                addr = factor_1->addr;
            }
        }